

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

void Spl_ManWinFindLeavesRoots(Spl_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pObj_00;
  bool bVar5;
  Gia_Obj_t *pObj;
  int k;
  int i;
  int iFan;
  int iObj;
  Vec_Int_t *vVec;
  Spl_Man_t *p_local;
  
  Vec_IntClear(p->vLeaves);
  pObj._4_4_ = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vAnds);
    if (iVar2 <= pObj._4_4_) {
      for (pObj._4_4_ = 0; iVar2 = Vec_IntSize(p->vLeaves), pObj._4_4_ < iVar2;
          pObj._4_4_ = pObj._4_4_ + 1) {
        iVar2 = Vec_IntEntry(p->vLeaves,pObj._4_4_);
        Vec_BitWriteEntry(p->vMarksAnd,iVar2,0);
      }
      Vec_IntClear(p->vRoots);
      pObj._4_4_ = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vNodes);
        bVar5 = false;
        if (pObj._4_4_ < iVar2) {
          pVVar1 = p->pGia->vMapping2;
          iVar2 = Vec_IntEntry(p->vNodes,pObj._4_4_);
          _iFan = Vec_WecEntry(pVVar1,iVar2);
          bVar5 = _iFan != (Vec_Int_t *)0x0;
        }
        if (!bVar5) break;
        for (pObj._0_4_ = 0; iVar2 = Vec_IntSize(_iFan), (int)pObj < iVar2;
            pObj._0_4_ = (int)pObj + 1) {
          iVar2 = Vec_IntEntry(_iFan,(int)pObj);
          Gia_ObjLutRefDecId(p->pGia,iVar2);
        }
        pObj._4_4_ = pObj._4_4_ + 1;
      }
      for (pObj._4_4_ = 0; iVar2 = Vec_IntSize(p->vAnds), pObj._4_4_ < iVar2;
          pObj._4_4_ = pObj._4_4_ + 1) {
        iVar2 = Vec_IntEntry(p->vAnds,pObj._4_4_);
        iVar4 = Gia_ObjLutRefNumId(p->pGia,iVar2);
        if (iVar4 != 0) {
          Vec_IntPush(p->vRoots,iVar2);
        }
      }
      pObj._4_4_ = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vNodes);
        bVar5 = false;
        if (pObj._4_4_ < iVar2) {
          pVVar1 = p->pGia->vMapping2;
          iVar2 = Vec_IntEntry(p->vNodes,pObj._4_4_);
          _iFan = Vec_WecEntry(pVVar1,iVar2);
          bVar5 = _iFan != (Vec_Int_t *)0x0;
        }
        if (!bVar5) break;
        for (pObj._0_4_ = 0; iVar2 = Vec_IntSize(_iFan), (int)pObj < iVar2;
            pObj._0_4_ = (int)pObj + 1) {
          iVar2 = Vec_IntEntry(_iFan,(int)pObj);
          Gia_ObjLutRefIncId(p->pGia,iVar2);
        }
        pObj._4_4_ = pObj._4_4_ + 1;
      }
      return;
    }
    iVar2 = Vec_IntEntry(p->vAnds,pObj._4_4_);
    pObj_00 = Gia_ManObj(p->pGia,iVar2);
    iVar4 = Vec_BitEntry(p->vMarksAnd,iVar2);
    if (iVar4 == 0) break;
    iVar4 = Gia_ObjFaninId0(pObj_00,iVar2);
    iVar3 = Vec_BitEntry(p->vMarksAnd,iVar4);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsLut2(p->pGia,iVar4);
      if ((iVar3 == 0) && (iVar3 = Vec_BitEntry(p->vMarksCIO,iVar4), iVar3 == 0)) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSplit.c"
                      ,0xd4,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
      }
      Vec_BitWriteEntry(p->vMarksAnd,iVar4,1);
      Vec_IntPush(p->vLeaves,iVar4);
    }
    iVar2 = Gia_ObjFaninId1(pObj_00,iVar2);
    iVar4 = Vec_BitEntry(p->vMarksAnd,iVar2);
    if (iVar4 == 0) {
      iVar4 = Gia_ObjIsLut2(p->pGia,iVar2);
      if ((iVar4 == 0) && (iVar4 = Vec_BitEntry(p->vMarksCIO,iVar2), iVar4 == 0)) {
        __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSplit.c"
                      ,0xdb,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
      }
      Vec_BitWriteEntry(p->vMarksAnd,iVar2,1);
      Vec_IntPush(p->vLeaves,iVar2);
    }
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  __assert_fail("Vec_BitEntry(p->vMarksAnd, iObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSplit.c"
                ,0xd0,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
}

Assistant:

void Spl_ManWinFindLeavesRoots( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int iObj, iFan, i, k;
    // collect leaves
/*
    Vec_IntClear( p->vLeaves );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
    {
        assert( Vec_BitEntry(p->vMarksNo, iObj) );
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) )
            {
                Vec_BitWriteEntry(p->vMarksNo, iFan, 1);
                Vec_IntPush( p->vLeaves, iFan );
            }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksNo, iFan, 0);
*/
    Vec_IntClear( p->vLeaves );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
        assert( Vec_BitEntry(p->vMarksAnd, iObj) );
        iFan = Gia_ObjFaninId0( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
        iFan = Gia_ObjFaninId1( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksAnd, iFan, 0);

    // collect roots
    Vec_IntClear( p->vRoots );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) )
            Vec_IntPush( p->vRoots, iObj );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
}